

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

TestStatus *
vkt::clipping::anon_unknown_0::ClipDistanceComplementarity::testComplementarity
          (TestStatus *__return_storage_ptr__,Context *context,int numClipDistances)

{
  UVec2 *this;
  deUint32 *this_00;
  DrawState *this_01;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestLog *pTVar2;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  int iVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  value_type local_5c8;
  Context *local_5b0;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  ConstPixelBufferAccess local_550;
  VulkanDrawContext drawContext;
  Random rnd;
  DrawState drawState;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x200);
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawContext,"vert",(allocator<char> *)&drawState);
  rnd.m_rnd._8_8_ = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext);
  rnd.m_rnd.x = 1;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&rnd);
  std::__cxx11::string::~string((string *)&drawContext);
  pPVar1 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawContext,"frag",(allocator<char> *)&drawState);
  rnd.m_rnd._8_8_ = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext);
  rnd.m_rnd.x = 0x10;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&rnd);
  std::__cxx11::string::~string((string *)&drawContext);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,0x4d2);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&drawContext,0x40,(allocator_type *)&drawState
            );
  for (lVar5 = 0;
      lVar5 < (int)((ulong)(drawContext.super_DrawContext.m_drawState._0_8_ -
                           (long)drawContext.super_DrawContext._vptr_DrawContext) >> 2);
      lVar5 = lVar5 + 1) {
    fVar6 = deRandom_getFloat(&rnd.m_rnd);
    *(float *)((long)drawContext.super_DrawContext._vptr_DrawContext + lVar5 * 4) =
         fVar6 + fVar6 + -1.0;
  }
  local_5b0 = context;
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    fVar6 = *(float *)(&DAT_009638c0 + (ulong)(iVar3 == 0) * 4);
    iVar4 = 0;
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 0x10) {
      local_5c8.m_data[0] = (float)iVar4 * 0.125 + -1.0;
      drawState.renderSize.m_data[1] =
           (uint)(*(float *)((long)drawContext.super_DrawContext._vptr_DrawContext + lVar5) * fVar6)
      ;
      drawState.colorFormat = 0xbf800000;
      drawState.renderSize.m_data[0] = 0;
      local_5c8.m_data[3] =
           *(float *)((long)drawContext.super_DrawContext._vptr_DrawContext + lVar5 + 4) * fVar6;
      local_5c8.m_data[1] = 1.0;
      local_5c8.m_data[2] = 0.0;
      vulkanProgram.shaders._0_4_ = local_5c8.m_data[0] + 0.125;
      drawCallData.vertices._4_4_ = 0x3f800000;
      vulkanProgram.shaders._4_4_ = 0xbf800000;
      drawCallData.vertices._0_4_ = vulkanProgram.shaders._0_4_;
      drawState.topology = (VkPrimitiveTopology)local_5c8.m_data[0];
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,(value_type *)&drawState);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,&local_5c8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,(value_type *)&drawCallData);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,(value_type *)&drawCallData);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,(value_type *)&vulkanProgram);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,(value_type *)&drawState);
      iVar4 = iVar4 + 1;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&drawContext);
  pTVar2 = local_5b0->m_testCtx->m_log;
  this = &drawState.renderSize;
  drawState.topology = (VkPrimitiveTopology)pTVar2;
  drawState.colorFormat = (VkFormat)((ulong)pTVar2 >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,
                  "Draw two sets of primitives with blending, differing only with ClipDistance sign."
                 );
  rnd.m_rnd._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)&drawState,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Using ");
  std::ostream::operator<<(this_00,numClipDistances);
  std::operator<<((ostream *)this_00,
                  " clipping plane(s), one of them possibly having negative values.");
  drawContext.super_DrawContext._vptr_DrawContext =
       (_func_int **)
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_01 = &drawContext.super_DrawContext.m_drawState;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,
                  "Expecting a uniform gray area, no missing (black) nor overlapped (white) pixels."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&drawContext,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  drawutil::DrawState::DrawState(&drawState,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0x80,0x80);
  vulkanProgram.shaders = &shaders;
  drawState.blendEnable = true;
  drawCallData.vertices = &vertices;
  drawutil::VulkanDrawContext::VulkanDrawContext
            (&drawContext,local_5b0,&drawState,&drawCallData,&vulkanProgram);
  drawutil::VulkanDrawContext::draw(&drawContext);
  drawutil::VulkanDrawContext::getColorPixels(&local_550,&drawContext);
  rnd.m_rnd.x = 0x3f000000;
  rnd.m_rnd.y = 0x3f000000;
  rnd.m_rnd.z = 0x3f000000;
  rnd.m_rnd.w = 0x3f800000;
  local_5c8.m_data[0] = 0.02;
  local_5c8.m_data[1] = 0.02;
  local_5c8.m_data[2] = 0.02;
  local_5c8.m_data[3] = 0.0;
  iVar3 = countPixels(&local_550,(Vec4 *)&rnd,&local_5c8);
  if (iVar3 == 0x4000) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rnd,"OK",(allocator<char> *)&local_5c8);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&rnd);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rnd,"Rendered image(s) are incorrect",(allocator<char> *)&local_5c8);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&rnd);
  }
  std::__cxx11::string::~string((string *)&rnd);
  drawutil::VulkanDrawContext::~VulkanDrawContext(&drawContext);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&vertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~_Vector_base
            (&shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testComplementarity (Context& context, const int numClipDistances)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();

		requireFeatures(vki, physDevice, FEATURE_SHADER_CLIP_DISTANCE);
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	std::vector<Vec4> vertices;
	{
		de::Random	rnd						(1234);
		const int	numSections				= 16;
		const int	numVerticesPerSection	= 4;	// logical verticies, due to triangle list topology we actually use 6 per section

		DE_ASSERT(RENDER_SIZE_LARGE % numSections == 0);

		std::vector<float> clipDistances(numVerticesPerSection * numSections);
		for (int i = 0; i < static_cast<int>(clipDistances.size()); ++i)
			clipDistances[i] = rnd.getFloat(-1.0f, 1.0f);

		// Two sets of identical primitives, but with a different ClipDistance sign.
		for (int setNdx = 0; setNdx < 2; ++setNdx)
		{
			const float sign = (setNdx == 0 ? 1.0f : -1.0f);
			const float	dx	 = 2.0f / static_cast<float>(numSections);

			for (int i = 0; i < numSections; ++i)
			{
				const int	ndxBase	= numVerticesPerSection * i;
				const float x		= -1.0f + dx * static_cast<float>(i);
				const Vec4	p0		= Vec4(x,      -1.0f, 0.0f, sign * clipDistances[ndxBase + 0]);
				const Vec4	p1		= Vec4(x,       1.0f, 0.0f, sign * clipDistances[ndxBase + 1]);
				const Vec4	p2		= Vec4(x + dx,  1.0f, 0.0f, sign * clipDistances[ndxBase + 2]);
				const Vec4	p3		= Vec4(x + dx, -1.0f, 0.0f, sign * clipDistances[ndxBase + 3]);

				vertices.push_back(p0);
				vertices.push_back(p1);
				vertices.push_back(p2);

				vertices.push_back(p2);
				vertices.push_back(p3);
				vertices.push_back(p0);
			}
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Draw two sets of primitives with blending, differing only with ClipDistance sign." << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << numClipDistances << " clipping plane(s), one of them possibly having negative values." << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting a uniform gray area, no missing (black) nor overlapped (white) pixels." << tcu::TestLog::EndMessage;

	DrawState					drawState		(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, RENDER_SIZE_LARGE, RENDER_SIZE_LARGE);
	DrawCallData				drawCallData	(vertices);
	VulkanProgram				vulkanProgram	(shaders);
	drawState.blendEnable		= true;

	VulkanDrawContext			drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	const int numGrayPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.5f, 0.5f, 0.5f, 1.0f), Vec4(0.02f, 0.02f, 0.02f, 0.0f));
	const int numExpectedPixels	= RENDER_SIZE_LARGE * RENDER_SIZE_LARGE;

	return (numGrayPixels == numExpectedPixels ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}